

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l0x.cpp
# Opt level: O2

void __thiscall
VL53L0X::writeRegisterMultiple(VL53L0X *this,uint8_t reg,uint8_t *source,uint8_t count)

{
  I2Cgeneric *pIVar1;
  uint8_t i;
  int iVar2;
  long lVar3;
  runtime_error *this_00;
  uint8_t data [4];
  
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    data[lVar3] = source[lVar3];
  }
  pIVar1 = (this->super_VL53LXX).i2c;
  iVar2 = (*pIVar1->_vptr_I2Cgeneric[0x1a])(pIVar1,(ulong)reg,(ulong)count,data);
  if ((char)iVar2 != '\0') {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Error writing block to register");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void VL53L0X::writeRegisterMultiple(uint8_t reg, const uint8_t* source, uint8_t count) {
	uint8_t data[4];
	for (uint8_t i = 0; i < 4; ++i) {
		data[i] = source[i];
	}
	bool p = this->i2c->writeBytes(reg, count, data);
	if (!p) {
		throw(std::runtime_error("Error writing block to register"));
	}
}